

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::LogFail<float>
          (ClearTest *this,bool use_sub_data,GLenum internalformat,float *data,float *reference,
          GLsizei count)

{
  ostringstream *this_00;
  ulong uVar1;
  string the_log;
  stringstream number;
  long *local_208;
  long local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  ClearTest *local_1c8;
  float *local_1c0;
  undefined1 local_1b8 [120];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  local_1e8 = local_1d8;
  local_1c8 = this;
  local_1c0 = reference;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"The test of ","");
  std::__cxx11::string::append((char *)&local_1e8);
  std::__cxx11::string::append((char *)&local_1e8);
  if (0 < count) {
    uVar1 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::_M_insert<double>((double)data[uVar1]);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_208);
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      if (count - 1 != uVar1) {
        std::__cxx11::string::append((char *)&local_1e8);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar1 = uVar1 + 1;
    } while ((uint)count != uVar1);
  }
  std::__cxx11::string::append((char *)&local_1e8);
  if (0 < count) {
    uVar1 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::_M_insert<double>((double)local_1c0[uVar1]);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)local_208);
      if (local_208 != local_1f8) {
        operator_delete(local_208,local_1f8[0] + 1);
      }
      if (count - 1 != uVar1) {
        std::__cxx11::string::append((char *)&local_1e8);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar1 = uVar1 + 1;
    } while ((uint)count != uVar1);
  }
  std::__cxx11::string::append((char *)&local_1e8);
  local_1b8._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_1e8,local_1e0)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_140);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  return;
}

Assistant:

void ClearTest::LogFail(bool use_sub_data, glw::GLenum internalformat, const T* data, const T* reference,
						const glw::GLsizei count)
{
	(void)internalformat;
	std::string the_log = "The test of ";

	if (use_sub_data)
	{
		the_log.append("ClearNamedBufferSubData has failed for internalformat ");
	}
	else
	{
		the_log.append("ClearNamedBufferData has failed for internalformat ");
	}

	//the_log.append(glu::getPixelFormatName(internalformat));
	the_log.append(". Cleared buffer data is equal to [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << data[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("], but [");

	for (glw::GLsizei i = 0; i < count; ++i)
	{
		std::stringstream number;

		number << reference[i];

		the_log.append(number.str());

		if (i != count - 1)
		{
			the_log.append(", ");
		}
	}

	the_log.append("] was expected.");

	m_context.getTestContext().getLog() << tcu::TestLog::Message << the_log << tcu::TestLog::EndMessage;
}